

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t assertion_equal_mem(char *file,wchar_t line,void *_v1,char *e1,void *_v2,char *e2,size_t l,
                           char *ld,void *extra)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  wchar_t wVar4;
  char *pcVar5;
  size_t offset;
  size_t l_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  assertions = assertions + L'\x01';
  msg = nextmsg;
  nextmsg = (char *)0x0;
  wVar4 = L'\x01';
  if (_v1 != _v2) {
    if ((_v2 != (void *)0x0 && _v1 != (void *)0x0) && (iVar3 = bcmp(_v1,_v2,l), iVar3 == 0)) {
      return L'\x01';
    }
    wVar4 = L'\0';
    if (_v2 != (void *)0x0 && _v1 != (void *)0x0) {
      wVar4 = L'\0';
      failure_start(file,line,"%s != %s",e1,e2);
      logprintf("      size %s = %d\n",ld,l & 0xffffffff);
      offset = 0;
      if (0x40 < l) {
        do {
          pcVar5 = (char *)((long)_v1 + offset);
          pcVar2 = (char *)((long)_v1 + offset + 0x10);
          pcVar1 = (char *)((long)_v2 + offset);
          auVar7[0] = -(*pcVar1 == *pcVar5);
          auVar7[1] = -(pcVar1[1] == pcVar5[1]);
          auVar7[2] = -(pcVar1[2] == pcVar5[2]);
          auVar7[3] = -(pcVar1[3] == pcVar5[3]);
          auVar7[4] = -(pcVar1[4] == pcVar5[4]);
          auVar7[5] = -(pcVar1[5] == pcVar5[5]);
          auVar7[6] = -(pcVar1[6] == pcVar5[6]);
          auVar7[7] = -(pcVar1[7] == pcVar5[7]);
          auVar7[8] = -(pcVar1[8] == pcVar5[8]);
          auVar7[9] = -(pcVar1[9] == pcVar5[9]);
          auVar7[10] = -(pcVar1[10] == pcVar5[10]);
          auVar7[0xb] = -(pcVar1[0xb] == pcVar5[0xb]);
          auVar7[0xc] = -(pcVar1[0xc] == pcVar5[0xc]);
          auVar7[0xd] = -(pcVar1[0xd] == pcVar5[0xd]);
          auVar7[0xe] = -(pcVar1[0xe] == pcVar5[0xe]);
          auVar7[0xf] = -(pcVar1[0xf] == pcVar5[0xf]);
          pcVar5 = (char *)((long)_v2 + offset + 0x10);
          auVar6[0] = -(*pcVar5 == *pcVar2);
          auVar6[1] = -(pcVar5[1] == pcVar2[1]);
          auVar6[2] = -(pcVar5[2] == pcVar2[2]);
          auVar6[3] = -(pcVar5[3] == pcVar2[3]);
          auVar6[4] = -(pcVar5[4] == pcVar2[4]);
          auVar6[5] = -(pcVar5[5] == pcVar2[5]);
          auVar6[6] = -(pcVar5[6] == pcVar2[6]);
          auVar6[7] = -(pcVar5[7] == pcVar2[7]);
          auVar6[8] = -(pcVar5[8] == pcVar2[8]);
          auVar6[9] = -(pcVar5[9] == pcVar2[9]);
          auVar6[10] = -(pcVar5[10] == pcVar2[10]);
          auVar6[0xb] = -(pcVar5[0xb] == pcVar2[0xb]);
          auVar6[0xc] = -(pcVar5[0xc] == pcVar2[0xc]);
          auVar6[0xd] = -(pcVar5[0xd] == pcVar2[0xd]);
          auVar6[0xe] = -(pcVar5[0xe] == pcVar2[0xe]);
          auVar6[0xf] = -(pcVar5[0xf] == pcVar2[0xf]);
          auVar6 = auVar6 & auVar7;
          if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) != 0xffff) break;
          l = l - 0x10;
          offset = offset + 0x10;
        } while (0x40 < l);
        _v2 = (void *)((long)_v2 + offset);
        _v1 = (void *)((long)_v1 + offset);
      }
      logprintf("      Dump of %s\n",e1);
      l_00 = 0x80;
      if (l < 0x80) {
        l_00 = l;
      }
      hexdump((char *)_v1,(char *)_v2,l_00,offset);
      logprintf("      Dump of %s\n",e2);
      hexdump((char *)_v2,(char *)_v1,l_00,offset);
      pcVar5 = "\n";
      logprintf("\n");
      failure_finish(pcVar5);
    }
  }
  return wVar4;
}

Assistant:

int
assertion_equal_mem(const char *file, int line,
    const void *_v1, const char *e1,
    const void *_v2, const char *e2,
    size_t l, const char *ld, void *extra)
{
	const char *v1 = (const char *)_v1;
	const char *v2 = (const char *)_v2;
	size_t offset;

	assertion_count(file, line);
	if (v1 == v2 || (v1 != NULL && v2 != NULL && memcmp(v1, v2, l) == 0))
		return (1);
	if (v1 == NULL || v2 == NULL)
		return (0);

	failure_start(file, line, "%s != %s", e1, e2);
	logprintf("      size %s = %d\n", ld, (int)l);
	/* Dump 48 bytes (3 lines) so that the first difference is
	 * in the second line. */
	offset = 0;
	while (l > 64 && memcmp(v1, v2, 32) == 0) {
		/* Two lines agree, so step forward one line. */
		v1 += 16;
		v2 += 16;
		l -= 16;
		offset += 16;
	}
	logprintf("      Dump of %s\n", e1);
	hexdump(v1, v2, l < 128 ? l : 128, offset);
	logprintf("      Dump of %s\n", e2);
	hexdump(v2, v1, l < 128 ? l : 128, offset);
	logprintf("\n");
	failure_finish(extra);
	return (0);
}